

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall libcellml::Model::Model(Model *this,string *name)

{
  ComponentEntityImpl *pImpl;
  
  pImpl = (ComponentEntityImpl *)operator_new(0xa0);
  memset(pImpl,0,0xa0);
  (pImpl->super_NamedEntityImpl).super_ParentedEntityImpl.super_EntityImpl.mId._M_dataplus._M_p =
       (pointer)&(pImpl->super_NamedEntityImpl).super_ParentedEntityImpl.super_EntityImpl.mId.
                 field_2;
  (pImpl->super_NamedEntityImpl).super_ParentedEntityImpl.super_EntityImpl.mId._M_string_length = 0;
  (pImpl->super_NamedEntityImpl).super_ParentedEntityImpl.super_EntityImpl.mId.field_2._M_local_buf
  [0] = '\0';
  (pImpl->super_NamedEntityImpl).super_ParentedEntityImpl.mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pImpl->super_NamedEntityImpl).super_ParentedEntityImpl.mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pImpl->super_NamedEntityImpl).mName._M_dataplus._M_p =
       (pointer)&(pImpl->super_NamedEntityImpl).mName.field_2;
  (pImpl->super_NamedEntityImpl).mName._M_string_length = 0;
  (pImpl->super_NamedEntityImpl).mName.field_2._M_local_buf[0] = '\0';
  (pImpl->mComponents).
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pImpl->mComponents).
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pImpl->mComponents).
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pImpl->mEncapsulationId)._M_dataplus._M_p = (pointer)&(pImpl->mEncapsulationId).field_2;
  (pImpl->mEncapsulationId)._M_string_length = 0;
  (pImpl->mEncapsulationId).field_2._M_local_buf[0] = '\0';
  pImpl[1].super_NamedEntityImpl.super_ParentedEntityImpl.super_EntityImpl.mId._M_dataplus._M_p =
       (pointer)0x0;
  pImpl[1].super_NamedEntityImpl.super_ParentedEntityImpl.super_EntityImpl.mId._M_string_length = 0;
  pImpl[1].super_NamedEntityImpl.super_ParentedEntityImpl.super_EntityImpl.mId.field_2.
  _M_allocated_capacity = 0;
  ComponentEntity::ComponentEntity(&this->super_ComponentEntity,pImpl);
  (this->super_enable_shared_from_this<libcellml::Model>)._M_weak_this.
  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<libcellml::Model>)._M_weak_this.
  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)&PTR__Model_002f6000;
  NamedEntity::setName((NamedEntity *)this,name);
  return;
}

Assistant:

Model::Model(const std::string &name)
    : ComponentEntity(new Model::ModelImpl())
{
    setName(name);
}